

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_sign.c
# Opt level: O0

err_t bignSign(octet *sig,bign_params *params,octet *oid_der,size_t oid_len,octet *hash,
              octet *privkey,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  word *a;
  word *mod;
  gen_i b;
  gen_i dest;
  word wVar5;
  word *in_RCX;
  void *in_RSI;
  void *in_RDI;
  word *in_R8;
  ec_o *in_R9;
  octet *stack;
  word *s1;
  word *s0;
  word *R;
  word *k;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_ffffffffffffff68;
  bign_params *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  octet *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  gen_i rng_00;
  word *c;
  word *a_00;
  bign_params *in_stack_ffffffffffffffa0;
  word *a_01;
  word *c_00;
  bign_deep_i in_stack_ffffffffffffffb8;
  word *b_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffff70);
    if (bVar1 == 0) {
      local_4 = 0x1f6;
    }
    else {
      if ((in_RCX != (word *)0xffffffffffffffff) &&
         (sVar4 = oidFromDER(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78), sVar4 != 0xffffffffffffffff)) {
        if (stack == (octet *)0x0) {
          return 0x130;
        }
        bignStart_keep(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
        a = (word *)blobCreate((size_t)in_stack_ffffffffffffff68);
        if (a == (word *)0x0) {
          return 0x6e;
        }
        eVar2 = bignStart(a,in_stack_ffffffffffffffa0);
        if (eVar2 != 0) {
          blobClose((blob_t)0x147d53);
          return eVar2;
        }
        b_00 = *(word **)(a[3] + 0x38);
        c_00 = *(word **)(a[3] + 0x30);
        a_01 = a;
        bVar1 = memIsValid(in_R8,(size_t)b_00);
        if ((((bVar1 != 0) && (bVar1 = memIsValid(in_R9,(size_t)b_00), bVar1 != 0)) &&
            (bVar1 = memIsValid(in_RDI,(long)b_00 + ((ulong)b_00 >> 1)), bVar1 != 0)) &&
           (bVar1 = memIsDisjoint2(in_R8,(size_t)b_00,in_RDI,(long)b_00 + ((ulong)b_00 >> 1)),
           bVar1 != 0)) {
          mod = (word *)((long)a + *a);
          c = mod + (long)c_00;
          rng_00 = (gen_i)(c + (long)c_00);
          b = rng_00 + ((ulong)c_00 >> 1) * 8 + (long)c_00 * 8;
          dest = rng_00 + (long)c_00 * 0x10;
          a_00 = mod;
          u64From((u64 *)dest,in_stack_ffffffffffffff68,0x147eb6);
          bVar1 = wwIsZero(a_00,(size_t)c_00);
          if ((bVar1 != 0) || (iVar3 = wwCmp(a_00,(word *)a[7],(size_t)c_00), -1 < iVar3)) {
            blobClose((blob_t)0x147ef1);
            return 0x1f8;
          }
          bVar1 = zzRandNZMod(a,a_00,(size_t)c,rng_00,b);
          if (bVar1 == 0) {
            blobClose((blob_t)0x147f38);
            return 0x130;
          }
          bVar1 = ecMulA(in_RCX,in_R8,in_R9,(word *)CONCAT44(eVar2,in_stack_ffffffffffffffc0),
                         (size_t)b_00,c_00);
          if (bVar1 == 0) {
            blobClose((blob_t)0x147f7e);
            return 0x1f6;
          }
          (**(code **)(a[3] + 0x48))(rng_00,rng_00,a[3],dest);
          beltHashStart(dest);
          beltHashStepH(b,(size_t)mod,dest);
          beltHashStepH(b,(size_t)mod,dest);
          beltHashStepH(b,(size_t)mod,dest);
          beltHashStepG2((octet *)b,(size_t)mod,dest);
          u64From((u64 *)dest,in_stack_ffffffffffffff68,0x14802f);
          zzMul(c_00,a_01,(size_t)a,a_00,(size_t)c,rng_00);
          wVar5 = zzAdd((word *)(rng_00 + ((ulong)c_00 >> 1) * 8),
                        (word *)(rng_00 + ((ulong)c_00 >> 1) * 8),a_00,(size_t)c_00);
          *(word *)(rng_00 + ((long)c_00 + ((ulong)c_00 >> 1)) * 8) = wVar5;
          zzMod(in_R8,(word *)in_R9,CONCAT44(eVar2,in_stack_ffffffffffffffc0),b_00,(size_t)c_00,a_01
               );
          zzSubMod(c,(word *)rng_00,(word *)b,mod,(size_t)dest);
          u64From((u64 *)dest,in_stack_ffffffffffffff68,0x148114);
          zzSubMod(c,(word *)rng_00,(word *)b,mod,(size_t)dest);
          u64To(dest,(size_t)in_stack_ffffffffffffff68,(u64 *)0x148158);
          blobClose((blob_t)0x148162);
          return 0;
        }
        blobClose((blob_t)0x147e11);
        return 0x6d;
      }
      local_4 = 0x12d;
    }
  }
  return local_4;
}

Assistant:

err_t bignSign(octet sig[], const bign_params* params, const octet oid_der[],
	size_t oid_len, const octet hash[], const octet privkey[], gen_i rng, 
	void* rng_state)
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;			
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	word* s0;				/* [n/2] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignSign_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(hash, no) ||
		!memIsValid(privkey, no) ||
		!memIsValid(sig, no + no / 2) ||
		!memIsDisjoint2(hash, no, sig, no + no / 2))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = s1 = objEnd(ec, word);
	k = d + n;
	R = k + n;
	s0 = R + n + n / 2;
	stack = (octet*)(R + 2 * n);
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// сгенерировать k с помощью rng
	if (!zzRandNZMod(k, ec->order, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 <- belt-hash(oid || R || H) mod 2^l
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(R, no, stack);
	beltHashStepH(hash, no, stack);
	beltHashStepG2(sig, no / 2, stack);
	wwFrom(s0, sig, no / 2);
	// R <- (s0 + 2^l) d
	zzMul(R, s0, n / 2, d, n, stack);
	R[n + n / 2] = zzAdd(R + n / 2, R + n / 2, d, n);
	// s1 <- R mod q
	zzMod(s1, R, n + n / 2 + 1, ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, no);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(sig + no / 2, no, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}